

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

natwm_error string_to_boolean(char *string,_Bool *result)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var1 = string_no_case_compare(string,"true");
  if ((!_Var1) && (_Var2 = string_no_case_compare(string,"false"), !_Var2)) {
    return INVALID_INPUT_ERROR;
  }
  *result = _Var1;
  return NO_ERROR;
}

Assistant:

enum natwm_error string_to_boolean(const char *string, bool *result)
{
        bool boolean = false;

        if (string_no_case_compare(string, "true")) {
                boolean = true;
        } else if (string_no_case_compare(string, "false")) {
                boolean = false;
        } else {
                return INVALID_INPUT_ERROR;
        }

        *result = boolean;

        return NO_ERROR;
}